

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format.c
# Opt level: O0

log_policy
log_policy_format_custom
          (void *context,log_policy_format_custom_size_ptr format_size,
          log_policy_format_custom_serialize_ptr format_serialize,
          log_policy_format_custom_deserialize_ptr format_deserialize)

{
  log_policy plVar1;
  undefined8 in_RSI;
  log_aspect_id aspect_id;
  log_policy_interface in_RDI;
  log_policy_format_custom_ctor_type custom_ctor;
  log_policy_ctor in_stack_ffffffffffffffb8;
  
  aspect_id = (log_aspect_id)((ulong)in_RSI >> 0x20);
  log_policy_format(0x106d6a);
  plVar1 = log_policy_create(aspect_id,in_RDI,in_stack_ffffffffffffffb8);
  return plVar1;
}

Assistant:

log_policy log_policy_format_custom(void *context, log_policy_format_custom_size_ptr format_size, log_policy_format_custom_serialize_ptr format_serialize, log_policy_format_custom_deserialize_ptr format_deserialize)
{
	struct log_policy_format_custom_ctor_type custom_ctor;

	custom_ctor.context = context;
	custom_ctor.format_size = format_size;
	custom_ctor.format_serialize = format_serialize;
	custom_ctor.format_deserialize = format_deserialize;

	return log_policy_create(LOG_ASPECT_FORMAT, log_policy_format(LOG_POLICY_FORMAT_CUSTOM), &custom_ctor);
}